

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t archive_acl_text_l(archive_acl *acl,wchar_t flags,char **acl_text,size_t *acl_text_len,
                          archive_string_conv *sc)

{
  wchar_t wVar1;
  archive_string_conv *paVar2;
  char *local_80;
  char *p;
  wchar_t r;
  wchar_t id;
  size_t len;
  archive_acl_entry *ap;
  char *pcStack_58;
  char separator;
  char *prefix;
  char *name;
  size_t length;
  archive_string_conv *paStack_38;
  wchar_t count;
  archive_string_conv *sc_local;
  size_t *acl_text_len_local;
  char **acl_text_local;
  archive_acl *paStack_18;
  wchar_t flags_local;
  archive_acl *acl_local;
  
  paStack_38 = sc;
  sc_local = (archive_string_conv *)acl_text_len;
  acl_text_len_local = (size_t *)acl_text;
  acl_text_local._4_4_ = flags;
  paStack_18 = acl;
  if (acl->acl_text != (char *)0x0) {
    free(acl->acl_text);
    paStack_18->acl_text = (char *)0x0;
  }
  *acl_text_len_local = 0;
  if (sc_local != (archive_string_conv *)0x0) {
    sc_local->next = (archive_string_conv *)0x0;
  }
  ap._7_1_ = ',';
  length._4_4_ = 0;
  name = (char *)0x0;
  len = (size_t)paStack_18->acl_head;
  do {
    if (len == 0) {
      if ((0 < length._4_4_) && ((acl_text_local._4_4_ & 0x100U) != 0)) {
        name = name + 0x20;
      }
      if (length._4_4_ == 0) {
        acl_local._4_4_ = L'\0';
      }
      else {
        local_80 = (char *)malloc((size_t)name);
        paStack_18->acl_text = local_80;
        if (local_80 == (char *)0x0) {
          acl_local._4_4_ = L'\xffffffff';
        }
        else {
          length._4_4_ = 0;
          if ((acl_text_local._4_4_ & 0x100U) != 0) {
            append_entry(&local_80,(char *)0x0,L'✒',(char *)0x0,paStack_18->mode & 0x1c0,
                         L'\xffffffff');
            *local_80 = ',';
            local_80 = local_80 + 1;
            append_entry(&local_80,(char *)0x0,L'✔',(char *)0x0,paStack_18->mode & 0x38,
                         L'\xffffffff');
            *local_80 = ',';
            local_80 = local_80 + 1;
            append_entry(&local_80,(char *)0x0,L'✖',(char *)0x0,paStack_18->mode & 7,L'\xffffffff'
                        );
            length._4_4_ = length._4_4_ + 3;
            for (len = (size_t)paStack_18->acl_head; len != 0; len = *(size_t *)len) {
              if ((*(uint *)(len + 8) & 0x100) != 0) {
                p._0_4_ = archive_mstring_get_mbs_l
                                    ((archive_mstring *)(len + 0x18),&prefix,(size_t *)&r,paStack_38
                                    );
                if ((wchar_t)p != L'\0') {
                  return L'\xffffffff';
                }
                *local_80 = ap._7_1_;
                if ((acl_text_local._4_4_ & 0x400U) == 0) {
                  p._4_4_ = L'\xffffffff';
                }
                else {
                  p._4_4_ = *(wchar_t *)(len + 0x14);
                }
                local_80 = local_80 + 1;
                append_entry(&local_80,(char *)0x0,*(wchar_t *)(len + 0xc),prefix,
                             *(wchar_t *)(len + 0x10),p._4_4_);
                length._4_4_ = length._4_4_ + 1;
              }
            }
          }
          if ((acl_text_local._4_4_ & 0x200U) != 0) {
            if ((acl_text_local._4_4_ & 0x800U) == 0) {
              pcStack_58 = (char *)0x0;
            }
            else {
              pcStack_58 = "default:";
            }
            length._4_4_ = 0;
            for (len = (size_t)paStack_18->acl_head; len != 0; len = *(size_t *)len) {
              if ((*(uint *)(len + 8) & 0x200) != 0) {
                p._0_4_ = archive_mstring_get_mbs_l
                                    ((archive_mstring *)(len + 0x18),&prefix,(size_t *)&r,paStack_38
                                    );
                if ((wchar_t)p != L'\0') {
                  return L'\xffffffff';
                }
                if (0 < length._4_4_) {
                  *local_80 = ap._7_1_;
                  local_80 = local_80 + 1;
                }
                if ((acl_text_local._4_4_ & 0x400U) == 0) {
                  p._4_4_ = L'\xffffffff';
                }
                else {
                  p._4_4_ = *(wchar_t *)(len + 0x14);
                }
                append_entry(&local_80,pcStack_58,*(wchar_t *)(len + 0xc),prefix,
                             *(wchar_t *)(len + 0x10),p._4_4_);
                length._4_4_ = length._4_4_ + 1;
              }
            }
          }
          *acl_text_len_local = (size_t)paStack_18->acl_text;
          if (sc_local != (archive_string_conv *)0x0) {
            paVar2 = (archive_string_conv *)strlen(paStack_18->acl_text);
            sc_local->next = paVar2;
          }
          acl_local._4_4_ = L'\0';
        }
      }
      return acl_local._4_4_;
    }
    if ((*(uint *)(len + 8) & acl_text_local._4_4_) != 0) {
      length._4_4_ = length._4_4_ + 1;
      if (((acl_text_local._4_4_ & 0x800U) != 0) && ((*(uint *)(len + 8) & 0x200) != 0)) {
        name = name + 8;
      }
      name = name + 6;
      wVar1 = archive_mstring_get_mbs_l
                        ((archive_mstring *)(len + 0x18),&prefix,(size_t *)&r,paStack_38);
      if (wVar1 != L'\0') {
        return L'\xffffffff';
      }
      if ((_r == 0) || (prefix == (char *)0x0)) {
        name = name + 0xd;
      }
      else {
        name = name + _r;
      }
      name = name + 0x13;
      p._0_4_ = L'\0';
    }
    len = *(size_t *)len;
  } while( true );
}

Assistant:

int
archive_acl_text_l(struct archive_acl *acl, int flags,
    const char **acl_text, size_t *acl_text_len,
    struct archive_string_conv *sc)
{
	int count;
	size_t length;
	const char *name;
	const char *prefix;
	char separator;
	struct archive_acl_entry *ap;
	size_t len;
	int id, r;
	char *p;

	if (acl->acl_text != NULL) {
		free (acl->acl_text);
		acl->acl_text = NULL;
	}

	*acl_text = NULL;
	if (acl_text_len != NULL)
		*acl_text_len = 0;
	separator = ',';
	count = 0;
	length = 0;
	ap = acl->acl_head;
	while (ap != NULL) {
		if ((ap->type & flags) != 0) {
			count++;
			if ((flags & ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT) &&
			    (ap->type & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT))
				length += 8; /* "default:" */
			length += 5; /* tag name */
			length += 1; /* colon */
			r = archive_mstring_get_mbs_l(
			    &ap->name, &name, &len, sc);
			if (r != 0)
				return (-1);
			if (len > 0 && name != NULL)
				length += len;
			else
				length += sizeof(uid_t) * 3 + 1;
			length ++; /* colon */
			length += 3; /* rwx */
			length += 1; /* colon */
			length += max(sizeof(uid_t), sizeof(gid_t)) * 3 + 1;
			length ++; /* newline */
		}
		ap = ap->next;
	}

	if (count > 0 && ((flags & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0)) {
		length += 10; /* "user::rwx\n" */
		length += 11; /* "group::rwx\n" */
		length += 11; /* "other::rwx\n" */
	}

	if (count == 0)
		return (0);

	/* Now, allocate the string and actually populate it. */
	p = acl->acl_text = (char *)malloc(length);
	if (p == NULL)
		return (-1);
	count = 0;
	if ((flags & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0) {
		append_entry(&p, NULL, ARCHIVE_ENTRY_ACL_USER_OBJ, NULL,
		    acl->mode & 0700, -1);
		*p++ = ',';
		append_entry(&p, NULL, ARCHIVE_ENTRY_ACL_GROUP_OBJ, NULL,
		    acl->mode & 0070, -1);
		*p++ = ',';
		append_entry(&p, NULL, ARCHIVE_ENTRY_ACL_OTHER, NULL,
		    acl->mode & 0007, -1);
		count += 3;

		for (ap = acl->acl_head; ap != NULL; ap = ap->next) {
			if ((ap->type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) == 0)
				continue;
			r = archive_mstring_get_mbs_l(
			    &ap->name, &name, &len, sc);
			if (r != 0)
				return (-1);
			*p++ = separator;
			if (flags & ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID)
				id = ap->id;
			else
				id = -1;
			append_entry(&p, NULL, ap->tag, name,
			    ap->permset, id);
			count++;
		}
	}


	if ((flags & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT) != 0) {
		if (flags & ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT)
			prefix = "default:";
		else
			prefix = NULL;
		count = 0;
		for (ap = acl->acl_head; ap != NULL; ap = ap->next) {
			if ((ap->type & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT) == 0)
				continue;
			r = archive_mstring_get_mbs_l(
			    &ap->name, &name, &len, sc);
			if (r != 0)
				return (-1);
			if (count > 0)
				*p++ = separator;
			if (flags & ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID)
				id = ap->id;
			else
				id = -1;
			append_entry(&p, prefix, ap->tag,
			    name, ap->permset, id);
			count ++;
		}
	}

	*acl_text = acl->acl_text;
	if (acl_text_len != NULL)
		*acl_text_len = strlen(acl->acl_text);
	return (0);
}